

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

void spdlog::details::fmt_helper::pad2<500ul>
               (int n,basic_memory_buffer<char,_500UL,_std::allocator<char>_> *dest)

{
  int in_EDI;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_00000008;
  int in_stack_00000014;
  undefined4 in_stack_00000020;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_00000028;
  char *in_stack_ffffffffffffffd8;
  basic_buffer<char> *in_stack_ffffffffffffffe0;
  
  if (in_EDI < 100) {
    if (in_EDI < 10) {
      if (in_EDI < 0) {
        fmt::v5::format_to<char[6],int,500ul,char>
                  (in_stack_00000028,(char (*) [6])CONCAT44(n,in_stack_00000020),(int *)dest);
      }
      else {
        fmt::v5::internal::basic_buffer<char>::push_back
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        fmt::v5::internal::basic_buffer<char>::push_back
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      }
    }
    else {
      fmt::v5::internal::basic_buffer<char>::push_back
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      fmt::v5::internal::basic_buffer<char>::push_back
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
  }
  else {
    append_int<int,500ul>(in_stack_00000014,in_stack_00000008);
  }
  return;
}

Assistant:

inline void pad2(int n, fmt::basic_memory_buffer<char, Buffer_Size> &dest)
{
    if (n > 99)
    {
        append_int(n, dest);
    }
    else if (n > 9) // 10-99
    {
        dest.push_back(static_cast<char>('0' + n / 10));
        dest.push_back(static_cast<char>('0' + n % 10));
    }
    else if (n >= 0) // 0-9
    {
        dest.push_back('0');
        dest.push_back(static_cast<char>('0' + n));
    }
    else // negatives (unlikely, but just in case, let fmt deal with it)
    {
        fmt::format_to(dest, "{:02}", n);
    }
}